

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructCmpxchg
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          StructCmpxchg *curr)

{
  char cVar1;
  Literal *pLVar2;
  Literal *this_00;
  undefined1 local_140 [8];
  Flow ref;
  Flow expected;
  Flow replacement;
  Literal oldVal;
  long local_38;
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_140,this,*(Expression **)(curr + 0x18));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x20));
    if (expected.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)&expected.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x28));
      if (replacement.breakTo.super_IString.str._M_len == 0) {
        Flow::getSingleValue((Flow *)local_140);
        ::wasm::Literal::getGCData();
        if (local_38 == 0) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        this_00 = (Literal *)
                  (*(long *)(local_38 + 0x28) + -0x18 + (ulong)*(uint *)(curr + 0x10) * 0x18);
        if ((ulong)*(uint *)(curr + 0x10) == 0) {
          this_00 = (Literal *)(local_38 + 0x10);
        }
        ::wasm::Literal::Literal((Literal *)&replacement.breakTo.super_IString.str._M_str,this_00);
        pLVar2 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
        cVar1 = ::wasm::Literal::operator==(this_00,pLVar2);
        if (cVar1 != '\0') {
          pLVar2 = Flow::getSingleValue((Flow *)&expected.breakTo.super_IString.str._M_str);
          ::wasm::Literal::operator=(this_00,pLVar2);
        }
        ::wasm::Literal::Literal
                  ((Literal *)&oldVal.type,(Literal *)&replacement.breakTo.super_IString.str._M_str)
        ;
        Flow::Flow(__return_storage_ptr__,(Literal *)&oldVal.type);
        ::wasm::Literal::~Literal((Literal *)&oldVal.type);
        ::wasm::Literal::~Literal((Literal *)&replacement.breakTo.super_IString.str._M_str);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&expected.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&expected.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_140);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_140);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructCmpxchg(StructCmpxchg* curr) {
    NOTE_ENTER("StructCmpxchg");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow expected = self()->visit(curr->expected);
    if (expected.breaking()) {
      return expected;
    }
    Flow replacement = self()->visit(curr->replacement);
    if (replacement.breaking()) {
      return replacement;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto& field = data->values[curr->index];
    auto oldVal = field;
    if (field == expected.getSingleValue()) {
      field = replacement.getSingleValue();
    }
    return oldVal;
  }